

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O3

iterator __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::Descriptor_const*,google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::Descriptor_const*const,google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>>>
::find<google::protobuf::Descriptor_const*>
          (raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::Descriptor_const*,google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::Descriptor_const*const,google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>>>
           *this,key_arg<const_google::protobuf::Descriptor_*> *key)

{
  char *pcVar1;
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>_>_>
  *this_00;
  long lVar2;
  uint uVar3;
  undefined1 auVar4 [16];
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  ushort uVar21;
  slot_type *psVar22;
  anon_union_8_1_a8a14541_for_iterator_2 aVar23;
  ulong extraout_RDX;
  ulong uVar24;
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>_>_>
  *prVar25;
  undefined1 uVar26;
  ulong uVar27;
  ulong uVar28;
  ulong i;
  uint uVar29;
  size_t cap_1;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  __m128i match;
  undefined1 auVar36 [16];
  iterator iVar37;
  undefined1 auVar38 [16];
  char cVar30;
  char cVar33;
  char cVar34;
  char cVar35;
  
  AssertOnFind<google::protobuf::Descriptor_const*>(this,key);
  prVar25 = *(raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>_>_>
              **)this;
  if (prVar25 ==
      (raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>_>_>
       *)0x1) {
    prVar25 = (raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>_>_>
               *)0x1;
    if (1 < *(ulong *)(this + 8)) {
      psVar22 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>_>_>
                ::soo_slot((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>_>_>
                            *)this);
      if ((psVar22->value).first == *key) {
        aVar23.slot_ = raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>_>_>
                       ::soo_slot((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>_>_>
                                   *)this);
        auVar31._0_8_ = kSooControl;
        auVar31._8_8_ = aVar23;
        return (iterator)auVar31;
      }
      prVar25 = *(raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>_>_>
                  **)this;
    }
LAB_002404d9:
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>_>_>
    ::AssertNotDebugCapacity(prVar25);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = extraout_RDX;
    return (iterator)(auVar4 << 0x40);
  }
  if (prVar25 !=
      (raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>_>_>
       *)0x0) {
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>_>_>
    ::prefetch_heap_block(prVar25);
    this_00 = *(raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>_>_>
                **)this;
    if (this_00 ==
        (raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>_>_>
         *)0x1) {
      __assert_fail("(!is_soo()) && \"Try enabling sanitizers.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                    ,0xe2a,
                    "iterator absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<const google::protobuf::Descriptor *, google::protobuf::(anonymous namespace)::GeneratedMessageFactory::MessagePtr>, absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Hash, absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Eq, std::allocator<std::pair<const google::protobuf::Descriptor *const, google::protobuf::(anonymous namespace)::GeneratedMessageFactory::MessagePtr>>>::find_non_soo(const key_arg<K> &, size_t) [Policy = absl::container_internal::FlatHashMapPolicy<const google::protobuf::Descriptor *, google::protobuf::(anonymous namespace)::GeneratedMessageFactory::MessagePtr>, Hash = absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Hash, Eq = absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Eq, Alloc = std::allocator<std::pair<const google::protobuf::Descriptor *const, google::protobuf::(anonymous namespace)::GeneratedMessageFactory::MessagePtr>>, K = const google::protobuf::Descriptor *]"
                   );
    }
    if (this_00 !=
        (raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>_>_>
         *)0x0) {
      if (((ulong)((long)&(this_00->settings_).
                          super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                          .
                          super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                          .value.capacity_ + 1U) & (ulong)this_00) != 0) {
        __assert_fail("(((mask + 1) & mask) == 0 && \"not a mask\") && \"Try enabling sanitizers.\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0x14c,
                      "absl::container_internal::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]"
                     );
      }
      uVar27 = ((ulong)*key ^ 0x457a38) * -0x234dd359734ecb13;
      uVar28 = ((uVar27 >> 0x38 | (uVar27 & 0xff000000000000) >> 0x28 |
                 (uVar27 & 0xff0000000000) >> 0x18 | (uVar27 & 0xff00000000) >> 8 |
                 (uVar27 & 0xff000000) << 8 | (uVar27 & 0xff0000) << 0x18 |
                 (uVar27 & 0xff00) << 0x28 | uVar27 << 0x38) ^ (ulong)*key) * -0x234dd359734ecb13;
      uVar27 = *(ulong *)(this + 0x10);
      uVar24 = (uVar28 >> 0x38 | (uVar28 & 0xff000000000000) >> 0x28 |
                (uVar28 & 0xff0000000000) >> 0x18 | (uVar28 & 0xff00000000) >> 8 |
                (uVar28 & 0xff000000) << 8 | (uVar28 & 0xff0000) << 0x18 | (uVar28 & 0xff00) << 0x28
               | uVar28 << 0x38) >> 7 ^ uVar27 >> 0xc;
      raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>_>_>
      ::control(this_00);
      uVar26 = (undefined1)(uVar28 >> 0x38);
      auVar31 = ZEXT216(CONCAT11(uVar26,uVar26) & 0x7f7f);
      auVar31 = pshuflw(auVar31,auVar31,0);
      uVar28 = 0;
      while( true ) {
        uVar24 = uVar24 & (ulong)this_00;
        pcVar1 = (char *)(uVar27 + uVar24);
        cVar5 = *pcVar1;
        cVar6 = pcVar1[1];
        cVar7 = pcVar1[2];
        cVar8 = pcVar1[3];
        cVar9 = pcVar1[4];
        cVar10 = pcVar1[5];
        cVar11 = pcVar1[6];
        cVar12 = pcVar1[7];
        cVar13 = pcVar1[8];
        cVar14 = pcVar1[9];
        cVar15 = pcVar1[10];
        cVar16 = pcVar1[0xb];
        cVar17 = pcVar1[0xc];
        cVar18 = pcVar1[0xd];
        cVar19 = pcVar1[0xe];
        cVar20 = pcVar1[0xf];
        cVar30 = auVar31[0];
        auVar32[0] = -(cVar30 == cVar5);
        cVar33 = auVar31[1];
        auVar32[1] = -(cVar33 == cVar6);
        cVar34 = auVar31[2];
        auVar32[2] = -(cVar34 == cVar7);
        cVar35 = auVar31[3];
        auVar32[3] = -(cVar35 == cVar8);
        auVar32[4] = -(cVar30 == cVar9);
        auVar32[5] = -(cVar33 == cVar10);
        auVar32[6] = -(cVar34 == cVar11);
        auVar32[7] = -(cVar35 == cVar12);
        auVar32[8] = -(cVar30 == cVar13);
        auVar32[9] = -(cVar33 == cVar14);
        auVar32[10] = -(cVar34 == cVar15);
        auVar32[0xb] = -(cVar35 == cVar16);
        auVar32[0xc] = -(cVar30 == cVar17);
        auVar32[0xd] = -(cVar33 == cVar18);
        auVar32[0xe] = -(cVar34 == cVar19);
        auVar32[0xf] = -(cVar35 == cVar20);
        uVar21 = (ushort)(SUB161(auVar32 >> 7,0) & 1) | (ushort)(SUB161(auVar32 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar32 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar32 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar32 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar32 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar32 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar32 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar32 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar32 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar32 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar32 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar32 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar32 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar32 >> 0x77,0) & 1) << 0xe | (ushort)(auVar32[0xf] >> 7) << 0xf
        ;
        uVar29 = (uint)uVar21;
        while (uVar21 != 0) {
          uVar3 = 0;
          if (uVar29 != 0) {
            for (; (uVar29 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
            }
          }
          lVar2 = *(long *)(this + 0x18);
          raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>_>_>
          ::slot_array(*(raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>_>_>
                         **)this);
          i = uVar3 + uVar24 & (ulong)this_00;
          if (*(key_arg<const_google::protobuf::Descriptor_*> *)(lVar2 + i * 0x10) == *key) {
            iVar37 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>_>_>
                     ::iterator_at((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>_>_>
                                    *)this,i);
            auVar38._0_8_ = iVar37.ctrl_;
            auVar38._8_8_ = iVar37.field_1;
            return (iterator)auVar38;
          }
          uVar21 = (ushort)(uVar29 - 1) & (ushort)uVar29;
          uVar29 = CONCAT22((short)(uVar29 - 1 >> 0x10),uVar21);
        }
        auVar36[0] = -(cVar5 == -0x80);
        auVar36[1] = -(cVar6 == -0x80);
        auVar36[2] = -(cVar7 == -0x80);
        auVar36[3] = -(cVar8 == -0x80);
        auVar36[4] = -(cVar9 == -0x80);
        auVar36[5] = -(cVar10 == -0x80);
        auVar36[6] = -(cVar11 == -0x80);
        auVar36[7] = -(cVar12 == -0x80);
        auVar36[8] = -(cVar13 == -0x80);
        auVar36[9] = -(cVar14 == -0x80);
        auVar36[10] = -(cVar15 == -0x80);
        auVar36[0xb] = -(cVar16 == -0x80);
        auVar36[0xc] = -(cVar17 == -0x80);
        auVar36[0xd] = -(cVar18 == -0x80);
        auVar36[0xe] = -(cVar19 == -0x80);
        auVar36[0xf] = -(cVar20 == -0x80);
        prVar25 = *(raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>_>_>
                    **)this;
        if ((((((((((((((((auVar36 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                         (auVar36 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar36 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar36 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar36 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar36 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar36 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar36 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar36 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar36 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar36 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar36 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar36 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar36 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar36 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || cVar20 == -0x80)
        break;
        if (prVar25 ==
            (raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>_>_>
             *)0x0) goto LAB_00240510;
        uVar24 = uVar28 + uVar24 + 0x10;
        uVar28 = uVar28 + 0x10;
        if (prVar25 < uVar28) {
          __assert_fail("(seq.index() <= capacity() && \"full table!\") && \"Try enabling sanitizers.\""
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0xe37,
                        "iterator absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<const google::protobuf::Descriptor *, google::protobuf::(anonymous namespace)::GeneratedMessageFactory::MessagePtr>, absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Hash, absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Eq, std::allocator<std::pair<const google::protobuf::Descriptor *const, google::protobuf::(anonymous namespace)::GeneratedMessageFactory::MessagePtr>>>::find_non_soo(const key_arg<K> &, size_t) [Policy = absl::container_internal::FlatHashMapPolicy<const google::protobuf::Descriptor *, google::protobuf::(anonymous namespace)::GeneratedMessageFactory::MessagePtr>, Hash = absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Hash, Eq = absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Eq, Alloc = std::allocator<std::pair<const google::protobuf::Descriptor *const, google::protobuf::(anonymous namespace)::GeneratedMessageFactory::MessagePtr>>, K = const google::protobuf::Descriptor *]"
                       );
        }
      }
      goto LAB_002404d9;
    }
  }
LAB_00240510:
  __assert_fail("cap >= kDefaultCapacity",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                ,0xb75,
                "size_t absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<const google::protobuf::Descriptor *, google::protobuf::(anonymous namespace)::GeneratedMessageFactory::MessagePtr>, absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Hash, absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Eq, std::allocator<std::pair<const google::protobuf::Descriptor *const, google::protobuf::(anonymous namespace)::GeneratedMessageFactory::MessagePtr>>>::capacity() const [Policy = absl::container_internal::FlatHashMapPolicy<const google::protobuf::Descriptor *, google::protobuf::(anonymous namespace)::GeneratedMessageFactory::MessagePtr>, Hash = absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Hash, Eq = absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Eq, Alloc = std::allocator<std::pair<const google::protobuf::Descriptor *const, google::protobuf::(anonymous namespace)::GeneratedMessageFactory::MessagePtr>>]"
               );
}

Assistant:

iterator find(const key_arg<K>& key) ABSL_ATTRIBUTE_LIFETIME_BOUND {
    AssertOnFind(key);
    if (is_soo()) return find_soo(key);
    prefetch_heap_block();
    return find_non_soo(key, hash_ref()(key));
  }